

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExtractSHRT.cpp
# Opt level: O1

void anon_unknown.dwarf_665eb::testMatrix(M44f *M)

{
  bool bVar1;
  ostream *poVar2;
  long lVar3;
  float (*pafVar4) [4];
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  V3f r;
  V3f t;
  V3f h;
  V3f s;
  Vec3<float> local_11c;
  float local_110;
  float local_10c;
  Matrix44<float> local_108;
  Vec3<float> local_bc;
  Vec3<float> local_b0;
  Vec3<float> local_a4;
  float local_98;
  float local_88;
  float local_78;
  Matrix44<float> local_68;
  
  bVar1 = Imath_3_2::extractSHRT<float>(M,&local_a4,&local_b0,&local_11c,&local_bc,true,Default);
  if (!bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Unable to extractSHRT");
    std::endl<char,std::char_traits<char>>(poVar2);
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                  ,0xd4,"void (anonymous namespace)::testMatrix(const M44f)");
  }
  local_108.x[0][0] = 1.0;
  local_108.x[0][1] = 0.0;
  local_108.x[0][2] = 0.0;
  local_108.x[0][3] = 0.0;
  local_108.x[1][0] = 0.0;
  local_108.x[1][1] = 1.0;
  local_108.x[1][2] = 0.0;
  local_108.x[1][3] = 0.0;
  local_108.x[2][0] = 0.0;
  local_108.x[2][1] = 0.0;
  local_108.x[2][2] = 1.0;
  local_108.x[2][3] = 0.0;
  local_108.x[3][0] = local_bc.z * 0.0 + local_bc.y * 0.0 + local_bc.x + 0.0;
  local_108.x[3][1] = local_bc.z * 0.0 + local_bc.x * 0.0 + local_bc.y + 0.0;
  local_108.x[3][2] = local_bc.x * 0.0 + local_bc.y * 0.0 + local_bc.z + 0.0;
  local_108.x[3][3] = local_bc.z * 0.0 + local_bc.x * 0.0 + local_bc.y * 0.0 + 1.0;
  local_10c = cosf(local_11c.z);
  local_78 = cosf(local_11c.y);
  local_110 = cosf(local_11c.x);
  local_88 = sinf(local_11c.z);
  local_98 = sinf(local_11c.y);
  fVar6 = sinf(local_11c.x);
  fVar7 = local_10c * local_78;
  fVar19 = local_78 * local_88;
  fVar13 = local_10c * local_98 * fVar6 - local_88 * local_110;
  fVar20 = local_10c * local_110 + local_88 * local_98 * fVar6;
  fVar10 = local_78 * fVar6;
  fVar22 = local_88 * fVar6 + local_110 * local_10c * local_98;
  fVar15 = local_110 * local_88 * local_98 - local_10c * fVar6;
  fVar21 = local_78 * local_110;
  fVar6 = (fVar7 * local_108.x[0][0] + fVar19 * local_108.x[1][0]) - local_98 * local_108.x[2][0];
  fVar8 = (fVar7 * local_108.x[0][1] + fVar19 * local_108.x[1][1]) - local_98 * local_108.x[2][1];
  fVar9 = (fVar7 * local_108.x[0][2] + fVar19 * local_108.x[1][2]) - local_98 * local_108.x[2][2];
  fVar7 = (fVar7 * local_108.x[0][3] + fVar19 * local_108.x[1][3]) - local_98 * local_108.x[2][3];
  fVar19 = fVar10 * local_108.x[2][0] + fVar13 * local_108.x[0][0] + fVar20 * local_108.x[1][0];
  fVar11 = fVar10 * local_108.x[2][1] + fVar13 * local_108.x[0][1] + fVar20 * local_108.x[1][1];
  fVar12 = fVar10 * local_108.x[2][2] + fVar13 * local_108.x[0][2] + fVar20 * local_108.x[1][2];
  fVar10 = fVar10 * local_108.x[2][3] + fVar13 * local_108.x[0][3] + fVar20 * local_108.x[1][3];
  fVar16 = fVar15 * local_108.x[1][0];
  fVar17 = fVar15 * local_108.x[1][1];
  fVar18 = fVar15 * local_108.x[1][2];
  fVar15 = fVar15 * local_108.x[1][3];
  fVar13 = fVar22 * local_108.x[0][0];
  fVar20 = fVar22 * local_108.x[0][1];
  fVar14 = fVar22 * local_108.x[0][2];
  fVar22 = fVar22 * local_108.x[0][3];
  local_108.x[0][0] = local_a4.x * fVar6;
  local_108.x[0][2] = local_a4.x * fVar9;
  local_108.x[0][1] = local_a4.x * fVar8;
  local_108.x[1][0] = local_a4.y * (local_b0.x * fVar6 + fVar19);
  local_108.x[1][1] = local_a4.y * (local_b0.x * fVar8 + fVar11);
  local_108.x[1][2] = local_a4.y * (local_b0.x * fVar9 + fVar12);
  local_108.x[1][3] = local_a4.y * (local_b0.x * fVar7 + fVar10);
  local_108.x[0][3] = local_a4.x * fVar7;
  local_108.x[2][0] =
       local_a4.z *
       (local_b0.y * fVar6 + local_b0.z * fVar19 + fVar21 * local_108.x[2][0] + fVar13 + fVar16);
  local_108.x[2][1] =
       local_a4.z *
       (local_b0.y * fVar8 + local_b0.z * fVar11 + fVar21 * local_108.x[2][1] + fVar20 + fVar17);
  local_108.x[2][2] =
       local_a4.z *
       (local_b0.y * fVar9 + local_b0.z * fVar12 + fVar21 * local_108.x[2][2] + fVar14 + fVar18);
  local_108.x[2][3] =
       local_a4.z *
       (local_b0.y * fVar7 + local_b0.z * fVar10 + fVar21 * local_108.x[2][3] + fVar22 + fVar15);
  pafVar4 = (float (*) [4])&local_68;
  local_68.x[0][0] = M->x[0][0] - local_108.x[0][0];
  local_68.x[0][1] = M->x[0][1] - local_a4.x * fVar8;
  local_68.x[0][2] = M->x[0][2] - local_a4.x * fVar9;
  local_68.x[0][3] = M->x[0][3] - local_a4.x * fVar7;
  local_68.x[1][0] = M->x[1][0] - local_108.x[1][0];
  local_68.x[1][1] = M->x[1][1] - local_108.x[1][1];
  local_68.x[1][2] = M->x[1][2] - local_108.x[1][2];
  local_68.x[1][3] = M->x[1][3] - local_108.x[1][3];
  local_68.x[2][0] = M->x[2][0] - local_108.x[2][0];
  local_68.x[2][1] = M->x[2][1] - local_108.x[2][1];
  local_68.x[2][2] = M->x[2][2] - local_108.x[2][2];
  local_68.x[2][3] = M->x[2][3] - local_108.x[2][3];
  local_68.x[3][0] = M->x[3][0] - local_108.x[3][0];
  local_68.x[3][1] = M->x[3][1] - local_108.x[3][1];
  local_68.x[3][2] = M->x[3][2] - local_108.x[3][2];
  local_68.x[3][3] = M->x[3][3] - local_108.x[3][3];
  lVar5 = 0;
  do {
    lVar3 = 0;
    do {
      if (1e-05 < ABS((*(float (*) [4])*pafVar4)[lVar3])) {
        poVar2 = std::operator<<((ostream *)&std::cout,
                                 "unexpectedly large matrix to euler angles conversion error: ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(*pafVar4)[lVar3]);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar5);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)lVar3);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"M\n");
        poVar2 = Imath_3_2::operator<<(poVar2,M);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"N\n");
        poVar2 = Imath_3_2::operator<<(poVar2,&local_108);
        std::endl<char,std::char_traits<char>>(poVar2);
        poVar2 = std::operator<<((ostream *)&std::cout,"D\n");
        poVar2 = Imath_3_2::operator<<(poVar2,&local_68);
        std::endl<char,std::char_traits<char>>(poVar2);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]Imath/src/ImathTest/testExtractSHRT.cpp"
                      ,0xfa,"void (anonymous namespace)::testMatrix(const M44f)");
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 4);
    lVar5 = lVar5 + 1;
    pafVar4 = pafVar4 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void
testMatrix (const M44f M)
{
    //
    // Extract Euler angles from M, and convert the
    // Euler angles back to a matrix, N.
    //

    V3f s, h, r, t;

    if (!extractSHRT (M, s, h, r, t, true))
    {
        cout << "Unable to extractSHRT" << std::endl;
        assert (false);
    }

    M44f N;

    N.translate (t); // ... matrix compositions
    N.rotate (r);
    N.shear (h);
    N.scale (s);

    debug (("Re-scale: %f %f %f\n", s[0], s[1], s[2]));
    debug (("Re-shear: %f %f %f\n", h[0], h[1], h[2]));
    debug (("Re-rot  : %f %f %f\n", r[0], r[1], r[2]));
    debug (("Re-trans: %f %f %f\n", t[0], t[1], t[2]));

    //
    // Verify that the entries in M and N do not
    // differ too much.
    //

    M44f D (M - N);

    for (int j = 0; j < 4; ++j)
    {
        for (int k = 0; k < 4; ++k)
        {
            if (abs (D[j][k]) > 0.00001)
            {
                cout << "unexpectedly large matrix to "
                        "euler angles conversion error: "
                     << D[j][k] << endl;

                cout << j << " " << k << endl;

                cout << "M\n" << M << endl;
                cout << "N\n" << N << endl;
                cout << "D\n" << D << endl;

                assert (false);
            }
        }
    }
}